

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O1

QString * __thiscall
QDBusMenuAdaptor::status(QString *__return_storage_ptr__,QDBusMenuAdaptor *this)

{
  qsizetype qVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QLoggingCategory *pQVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  QDebug local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QtPrivateLogging::qLcMenu();
  if (((pQVar6->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_30 = pQVar6->name;
    local_48 = 2;
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    uStack_34 = 0;
    QMessageLogger::debug();
    QDebug::~QDebug(&local_20);
  }
  QVar7.m_data = &DAT_00000006;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromLatin1(QVar7);
  uVar5 = uStack_3c;
  uVar4 = uStack_40;
  uVar3 = uStack_44;
  uVar2 = local_48;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar2;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar3;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar4;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar5;
  qVar1 = CONCAT44(uStack_34,uStack_38);
  uStack_38 = 0;
  uStack_34 = 0;
  (__return_storage_ptr__->d).size = qVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDBusMenuAdaptor::status() const
{
    qCDebug(qLcMenu);
    return "normal"_L1;
}